

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::wheelEvent(QGraphicsProxyWidget *this,QGraphicsSceneWheelEvent *event)

{
  QPointer<QWidget> *other;
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  ScrollPhase SVar3;
  Orientation OVar4;
  uint uVar5;
  MouseButtons MVar6;
  KeyboardModifiers KVar7;
  QWidget *pQVar8;
  QPoint QVar9;
  undefined8 uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QPointF QVar12;
  QArrayDataPointer<char16_t> local_f8;
  double local_d8;
  double local_d0;
  QWheelEvent wheelEvent;
  QWeakPointer<QObject> local_68;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  other = &this_00->widget;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)other);
  if (!bVar2) goto LAB_005904d6;
  QVar12 = QGraphicsSceneWheelEvent::pos(event);
  local_48.yp = QVar12.yp;
  local_48.xp = QVar12.xp;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = (other->wp).d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = (QWidget *)(this_00->widget).wp.value;
  }
  _wheelEvent = QPointF::toPoint(&local_48);
  pQVar8 = QWidget::childAt(pQVar8,(QPoint *)&wheelEvent);
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_58,pQVar8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
  if (!bVar2) {
    QWeakPointer<QObject>::operator=(&local_58,&other->wp);
  }
  local_68.d = QApplicationPrivate::wheel_widget.wp.d;
  local_68.value = QApplicationPrivate::wheel_widget.wp.value;
  if (QApplicationPrivate::wheel_widget.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)QApplicationPrivate::wheel_widget.wp.d =
         *(int *)QApplicationPrivate::wheel_widget.wp.d + 1;
    UNLOCK();
  }
  SVar3 = QGraphicsSceneWheelEvent::phase(event);
  if (SVar3 == ScrollBegin) {
    QWeakPointer<QObject>::operator=(&QApplicationPrivate::wheel_widget.wp,&local_58);
LAB_00590238:
    if ((local_58.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    QVar12 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_48,pQVar8);
    local_48.yp = QVar12.yp;
    local_48.xp = QVar12.xp;
    OVar4 = QGraphicsSceneWheelEvent::orientation(event);
    uVar5 = QGraphicsSceneWheelEvent::delta(event);
    uVar11 = (ulong)uVar5 << 0x20;
    if (OVar4 == Horizontal) {
      uVar11 = (ulong)uVar5;
    }
    _wheelEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QVar9 = QGraphicsSceneWheelEvent::screenPos(event);
    local_d8 = (double)QVar9.xp.m_i.m_i;
    local_d0 = (double)QVar9.yp.m_i.m_i;
    QVar9 = QGraphicsSceneWheelEvent::pixelDelta(event);
    MVar6 = QGraphicsSceneWheelEvent::buttons(event);
    KVar7 = QGraphicsSceneWheelEvent::modifiers(event);
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    bVar2 = QGraphicsSceneWheelEvent::isInverted(event);
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (char16_t *)0x0;
    local_f8.size = 0;
    uVar10 = QPointingDevice::primaryPointingDevice((QString *)&local_f8);
    QWheelEvent::QWheelEvent
              (&wheelEvent,&local_48,&local_d8,QVar9,uVar11,
               MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i,
               KVar7.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i,SVar3,bVar2,2,uVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
    QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_f8,pQVar8);
    if ((local_58.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    qt_sendSpontaneousEvent(&pQVar8->super_QObject,(QEvent *)&wheelEvent);
    (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
    QGraphicsSceneWheelEvent::phase(event);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_f8);
    if ((bVar2) && (bVar2 = QWidget::hasFocus((QWidget *)local_f8.ptr), !bVar2)) {
      QWidget::update((QWidget *)local_f8.ptr);
      pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)&local_f8,&pQVar8->super_QObject);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_f8);
      if ((bVar2) && (bVar2 = QWidget::hasFocus((QWidget *)local_f8.ptr), bVar2)) {
        QWidget::update((QWidget *)local_f8.ptr);
      }
    }
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_f8);
    QWheelEvent::~QWheelEvent(&wheelEvent);
  }
  else {
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    if ((SVar3 == NoScrollPhase) ||
       (bVar2 = ::operator!=(&QApplicationPrivate::wheel_widget,(QPointer<QWidget> *)&local_58),
       !bVar2)) goto LAB_00590238;
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
  QWeakPointer<QObject>::~QWeakPointer(&local_58);
LAB_005904d6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::wheelEvent(QGraphicsSceneWheelEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::wheelEvent");
#endif
    if (!d->widget)
        return;

    QPointF pos = event->pos();
    QPointer<QWidget> receiver = d->widget->childAt(pos.toPoint());
    if (!receiver)
        receiver = d->widget;

    // high precision event streams go to the grabber, which will be the
    // QGraphicsView's viewport. We need to change that temporarily, otherwise
    // the event we send to the receiver get grabbed by the viewport, resulting
    // in infinite recursion
    QPointer<QWidget> prev_grabber = QApplicationPrivate::wheel_widget;
    if (event->phase() == Qt::ScrollBegin) {
        QApplicationPrivate::wheel_widget = receiver;
    } else if (event->phase() != Qt::NoScrollPhase && QApplicationPrivate::wheel_widget != receiver) {
        // this event is part of a stream that didn't start here, so ignore
        event->ignore();
        return;
    }

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    // Send mouse event.
    QPoint angleDelta;
    if (event->orientation() == Qt::Horizontal)
        angleDelta.setX(event->delta());
    else
        angleDelta.setY(event->delta());
    // pixelDelta, inverted, scrollPhase and source from the original QWheelEvent
    // were not preserved in the QGraphicsSceneWheelEvent unfortunately
    QWheelEvent wheelEvent(pos, event->screenPos(), event->pixelDelta(), angleDelta,
                           event->buttons(), event->modifiers(), event->phase(),
                           event->isInverted(), Qt::MouseEventSynthesizedByQt,
                           QPointingDevice::primaryPointingDevice());
    QPointer<QWidget> focusWidget = d->widget->focusWidget();
    extern bool qt_sendSpontaneousEvent(QObject *, QEvent *);
    qt_sendSpontaneousEvent(receiver, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());

    if (event->phase() == Qt::ScrollBegin) {
        // reset the wheel grabber if the event wasn't accepted
        if (!wheelEvent.isAccepted())
            QApplicationPrivate::wheel_widget = prev_grabber;
    }

    // ### Remove, this should be done by proper focusIn/focusOut events.
    if (focusWidget && !focusWidget->hasFocus()) {
        focusWidget->update();
        focusWidget = d->widget->focusWidget();
        if (focusWidget && focusWidget->hasFocus())
            focusWidget->update();
    }
}